

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void __thiscall
jessilib::format_not_available::format_not_available(format_not_available *this,string *in_format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Format \"",in_format);
  std::operator+(&local_50,&local_30,"\"not recognized");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001e6108;
  return;
}

Assistant:

format_not_available::format_not_available(const std::string& in_format)
	: std::runtime_error{ "Format \"" + in_format + "\"not recognized" } {
	// Empty ctor body
}